

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_to_bgr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<cv::Mat> __l;
  int iVar1;
  char *pcVar2;
  Mat *local_ac0;
  _InputArray local_a68;
  allocator<char> local_a49;
  string local_a48 [32];
  vector<int,_std::allocator<int>_> local_a28;
  _InputArray local_a10;
  allocator<char> local_9f1;
  string local_9f0 [32];
  Scalar_<double> local_9d0;
  Vec<int,_2> local_9b0;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_9a8;
  imgviz local_990 [8];
  Mat viz;
  allocator<cv::Mat> local_929;
  Mat *local_928;
  Mat local_920 [96];
  Mat local_8c0 [96];
  Mat local_860 [96];
  iterator local_800;
  size_type local_7f8;
  undefined1 local_7f0 [8];
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  Mat local_788 [96];
  imgviz local_728 [103];
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  Mat local_678 [96];
  imgviz local_618 [103];
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  Mat local_568 [96];
  imgviz local_508 [96];
  Mat local_4a8 [96];
  imgviz local_448 [8];
  Mat depth_bgr;
  _OutputArray local_3e8;
  double local_3d0;
  Mat local_3c8 [96];
  undefined1 local_368 [8];
  Mat depth_normalized;
  double local_308;
  Mat local_300 [352];
  _InputArray local_1a0;
  double local_188;
  _InputArray local_180;
  _OutputArray local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  Mat depth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [8];
  Mat bgr;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string data_dir;
  char **argv_local;
  int argc_local;
  
  data_dir.field_2._8_8_ = argv;
  if (argc != 2) {
    __assert_fail("argc == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                  ,4,"int main(int, char **)");
  }
  pcVar2 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::operator+(&local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "/rgb.png");
  cv::imread(local_b0,(int)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "/depth.png");
  cv::imread((string *)local_130,(int)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  iVar1 = cv::Mat::type((Mat *)local_130);
  if (iVar1 == 2) {
    cv::_OutputArray::_OutputArray(&local_168,(Mat *)local_130);
    cv::Mat::convertTo((_OutputArray *)local_130,(int)&local_168,1.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_168);
    local_188 = NAN;
    cv::_InputArray::_InputArray(&local_180,&local_188);
    cv::operator==(local_300,0.0);
    cv::_InputArray::_InputArray(&local_1a0,(MatExpr *)local_300);
    cv::Mat::setTo((_InputArray *)local_130,&local_180);
    cv::_InputArray::~_InputArray(&local_1a0);
    cv::MatExpr::~MatExpr((MatExpr *)local_300);
    cv::_InputArray::~_InputArray(&local_180);
    local_308 = 1000.0;
    cv::operator/=((Mat *)local_130,&local_308);
    cv::Mat::Mat(local_3c8,(Mat *)local_130);
    imgviz::normalize((imgviz *)local_368,local_3c8,0.3,1.0);
    cv::Mat::~Mat(local_3c8);
    local_3d0 = 255.0;
    cv::operator*=((Mat *)local_368,&local_3d0);
    cv::_OutputArray::_OutputArray(&local_3e8,(Mat *)local_368);
    cv::Mat::convertTo((_OutputArray *)local_368,(int)&local_3e8,1.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_3e8);
    cv::Mat::Mat(local_4a8,(Mat *)local_130);
    imgviz::depthToBgr(local_448,local_4a8,0.3,1.0);
    cv::Mat::~Mat(local_4a8);
    cv::Mat::Mat(local_568,(Mat *)local_b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"bgr",&local_589);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"lt+",&local_5b1);
    imgviz::textInRectangle(local_508,local_568,&local_588,&local_5b0,0,1.0,2);
    cv::Mat::operator=((Mat *)local_b0,(Mat *)local_508);
    cv::Mat::~Mat((Mat *)local_508);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator(&local_5b1);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    cv::Mat::~Mat(local_568);
    cv::Mat::Mat(local_678,(Mat *)local_368);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,"depth_normalized",&local_699);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"lt+",&local_6c1);
    imgviz::textInRectangle(local_618,local_678,&local_698,&local_6c0,0,1.0,2);
    cv::Mat::operator=((Mat *)local_368,(Mat *)local_618);
    cv::Mat::~Mat((Mat *)local_618);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::allocator<char>::~allocator(&local_6c1);
    std::__cxx11::string::~string((string *)&local_698);
    std::allocator<char>::~allocator(&local_699);
    cv::Mat::~Mat(local_678);
    cv::Mat::Mat(local_788,(Mat *)local_448);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"depth_bgr",&local_7a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d0,"lt+",
               (allocator<char> *)
               ((long)&images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    imgviz::textInRectangle(local_728,local_788,&local_7a8,&local_7d0,0,1.0,2);
    cv::Mat::operator=((Mat *)local_448,(Mat *)local_728);
    cv::Mat::~Mat((Mat *)local_728);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&images.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator(&local_7a9);
    cv::Mat::~Mat(local_788);
    local_928 = local_920;
    cv::Mat::Mat(local_928,(Mat *)local_b0);
    local_928 = local_8c0;
    cv::Mat::Mat(local_928,(Mat *)local_368);
    local_928 = local_860;
    cv::Mat::Mat(local_928,(Mat *)local_448);
    local_800 = local_920;
    local_7f8 = 3;
    std::allocator<cv::Mat>::allocator(&local_929);
    __l._M_len = local_7f8;
    __l._M_array = local_800;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_7f0,__l,&local_929);
    std::allocator<cv::Mat>::~allocator(&local_929);
    local_ac0 = (Mat *)&local_800;
    do {
      local_ac0 = local_ac0 + -0x60;
      cv::Mat::~Mat(local_ac0);
    } while (local_ac0 != local_920);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              (&local_9a8,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_7f0);
    cv::Vec<int,_2>::Vec(&local_9b0,1,3);
    cv::Scalar_<double>::Scalar_(&local_9d0,255.0,255.0,255.0,0.0);
    imgviz::tile(local_990,&local_9a8,&local_9b0,5,&local_9d0);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_9a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_9f0,"depth_to_bgr.png",&local_9f1);
    cv::_InputArray::_InputArray(&local_a10,(Mat *)local_990);
    local_a28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_a28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_a28);
    cv::imwrite(local_9f0,&local_a10,(vector *)&local_a28);
    std::vector<int,_std::allocator<int>_>::~vector(&local_a28);
    cv::_InputArray::~_InputArray(&local_a10);
    std::__cxx11::string::~string(local_9f0);
    std::allocator<char>::~allocator(&local_9f1);
    pcVar2 = getenv("CI");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = *(char **)data_dir.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a48,pcVar2,&local_a49);
      cv::_InputArray::_InputArray(&local_a68,(Mat *)local_990);
      cv::imshow(local_a48,&local_a68);
      cv::_InputArray::~_InputArray(&local_a68);
      std::__cxx11::string::~string(local_a48);
      std::allocator<char>::~allocator(&local_a49);
      cv::waitKey(0);
    }
    cv::Mat::~Mat((Mat *)local_990);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)local_7f0);
    cv::Mat::~Mat((Mat *)local_448);
    cv::Mat::~Mat((Mat *)local_368);
    cv::Mat::~Mat((Mat *)local_130);
    cv::Mat::~Mat((Mat *)local_b0);
    std::__cxx11::string::~string((string *)local_38);
    return 0;
  }
  __assert_fail("depth.type() == CV_16UC1",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                ,9,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  assert(argc == 2);

  std::string data_dir = std::string(argv[1]);
  cv::Mat bgr = cv::imread(data_dir + "/rgb.png");
  cv::Mat depth = cv::imread(data_dir + "/depth.png", -1);
  assert(depth.type() == CV_16UC1);
  depth.convertTo(depth, CV_32FC1);
  depth.setTo(NAN, depth == 0);
  depth /= 1000;

  cv::Mat depth_normalized =
      imgviz::normalize(depth, /*min_val=*/0.3, /*max_val=*/1);
  depth_normalized *= 255;
  depth_normalized.convertTo(depth_normalized, CV_8UC1);

  cv::Mat depth_bgr = imgviz::depthToBgr(depth, /*min_val=*/0.3, /*max_val=*/1);

  bgr = imgviz::textInRectangle(bgr, "bgr");
  depth_normalized =
      imgviz::textInRectangle(depth_normalized, "depth_normalized");
  depth_bgr = imgviz::textInRectangle(depth_bgr, "depth_bgr");

  std::vector<cv::Mat> images = {bgr, depth_normalized, depth_bgr};
  cv::Mat viz = imgviz::tile(images, /*shape=*/cv::Vec2i(1, 3));

  cv::imwrite("depth_to_bgr.png", viz);
  if (!std::getenv("CI")) {
    cv::imshow(argv[0], viz);
    cv::waitKey(0);
  }
}